

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

void __thiscall ICOReader::readColorTable(ICOReader *this,QImage *image)

{
  long lVar1;
  QImage *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  uchar rgb [4];
  QImage *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_54;
  QImage local_40 [24];
  QImage local_28 [28];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x18) == 0) {
    QImage::QImage(local_40);
    QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
    QImage::~QImage(local_40);
  }
  else {
    QImage::setColorCount((int)in_RSI);
    local_c = 0xaaaaaaaa;
    for (local_54 = 0; (int)local_54 < *(int *)(in_RDI + 4); local_54 = local_54 + 1) {
      lVar1 = QIODevice::read(*(char **)(in_RDI + 0x18),(longlong)&local_c);
      if (lVar1 != 4) {
        QImage::QImage(local_28);
        QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff90);
        QImage::~QImage(local_28);
        break;
      }
      in_stack_ffffffffffffff90 = in_RSI;
      in_stack_ffffffffffffff9c = local_54;
      qRgb(local_c >> 0x10 & 0xff,local_c >> 8 & 0xff,local_c & 0xff);
      QImage::setColor((int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ICOReader::readColorTable(QImage & image)
{
    if (iod) {
        image.setColorCount(icoAttrib.ncolors);
        uchar rgb[4];
        for (int i=0; i<icoAttrib.ncolors; i++) {
            if (iod->read((char*)rgb, 4) != 4) {
            image = QImage();
            break;
            }
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
        }
    } else {
        image = QImage();
    }
}